

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

bool semver::operator==(version<int,_int,_int> *lhs,version<int,_int,_int> *rhs)

{
  int iVar1;
  version<int,_int,_int> *rhs_local;
  version<int,_int,_int> *lhs_local;
  
  iVar1 = detail::compare_parsed<int,int,int>(lhs,rhs,include_prerelease);
  return iVar1 == 0;
}

Assistant:

[[nodiscard]] SEMVER_CONSTEXPR bool operator==(const version<I1, I2, I3>& lhs, const version<I1, I2, I3>& rhs) noexcept {
  return detail::compare_parsed(lhs, rhs, version_compare_option::include_prerelease) == 0;
}